

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled.cpp
# Opt level: O2

void __thiscall
randomx::CompiledVm<randomx::LargePageAllocator,_false,_true>::CompiledVm
          (CompiledVm<randomx::LargePageAllocator,_false,_true> *this)

{
  *(undefined8 *)&this->field_0x9e8 = 0;
  *(undefined8 *)&this->field_0x9f0 = 0;
  *(undefined8 *)&this->field_0x9f8 = 0;
  *(undefined1 **)&this->field_0xa08 = &this->field_0xa18;
  *(undefined8 *)&this->field_0xa10 = 0;
  this->field_0xa18 = 0;
  *(undefined ***)this = &PTR__CompiledVm_0011fa90;
  JitCompilerX86::JitCompilerX86(&this->compiler);
  return;
}

Assistant:

CompiledVm<Allocator, softAes, secureJit>::CompiledVm() {
		if (!secureJit) {
			compiler.enableAll(); //make JIT buffer both writable and executable
		}
	}